

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animation_engine.cpp
# Opt level: O0

void __thiscall
cppurses::Animation_engine::register_widget
          (Animation_engine *this,Widget *w,
          function<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_()> *period_func)

{
  reference pvVar1;
  pointer pTVar2;
  undefined8 local_20;
  function<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_()> *period_func_local;
  Widget *w_local;
  Animation_engine *this_local;
  
  local_20 = period_func;
  period_func_local = (function<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_()> *)w;
  w_local = (Widget *)this;
  std::
  make_unique<cppurses::detail::Timer_event_loop,std::function<std::chrono::duration<long,std::ratio<1l,1000l>>()>const&>
            ((function<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_()> *)
             &stack0xffffffffffffffd8);
  std::
  vector<std::unique_ptr<cppurses::detail::Timer_event_loop,std::default_delete<cppurses::detail::Timer_event_loop>>,std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,std::default_delete<cppurses::detail::Timer_event_loop>>>>
  ::
  emplace_back<std::unique_ptr<cppurses::detail::Timer_event_loop,std::default_delete<cppurses::detail::Timer_event_loop>>>
            ((vector<std::unique_ptr<cppurses::detail::Timer_event_loop,std::default_delete<cppurses::detail::Timer_event_loop>>,std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,std::default_delete<cppurses::detail::Timer_event_loop>>>>
              *)&this->variable_loops_,
             (unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
              *)&stack0xffffffffffffffd8);
  std::
  unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
  ::~unique_ptr((unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
                 *)&stack0xffffffffffffffd8);
  pvVar1 = std::
           vector<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>
           ::back(&this->variable_loops_);
  pTVar2 = std::
           unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
           ::operator->(pvVar1);
  detail::Timer_event_loop::register_widget(pTVar2,(Widget *)period_func_local);
  pvVar1 = std::
           vector<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>
           ::back(&this->variable_loops_);
  pTVar2 = std::
           unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
           ::operator->(pvVar1);
  Event_loop::run_async(&pTVar2->super_Event_loop);
  return;
}

Assistant:

void Animation_engine::register_widget(
    Widget& w,
    const std::function<Period_t()>& period_func)
{
    variable_loops_.emplace_back(
        std::make_unique<detail::Timer_event_loop>(period_func));
    variable_loops_.back()->register_widget(w);
    variable_loops_.back()->run_async();
}